

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::session_stats_alert::session_stats_alert
          (session_stats_alert *this,stack_allocator *param_1,counters *cnt)

{
  array<std::int64_t,_counters::num_counters> local_978;
  counters *local_20;
  counters *cnt_local;
  stack_allocator *param_1_local;
  session_stats_alert *this_local;
  
  local_20 = cnt;
  cnt_local = (counters *)param_1;
  param_1_local = (stack_allocator *)this;
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__session_stats_alert_00991d30;
  anon_unknown_62::counters_to_array(&local_978,local_20);
  memcpy(&this->values,&local_978,0x958);
  return;
}

Assistant:

session_stats_alert::session_stats_alert(aux::stack_allocator&, struct counters const& cnt)
		: values(counters_to_array(cnt))
	{}